

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int64_t fio_atol(char **pstr)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  bool bVar8;
  byte *local_20;
  
  pbVar5 = (byte *)*pstr;
  ppuVar4 = __ctype_b_loc();
  do {
    local_20 = pbVar5;
    bVar1 = *local_20;
    pbVar5 = local_20 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (long)(char)bVar1 * 2 + 1) & 0x20) != 0);
  if ((bVar1 == 0x2d) || (bVar1 == 0x2b)) {
    local_20 = local_20 + 1;
  }
  bVar2 = *local_20;
  pbVar5 = local_20;
  if (bVar2 == 0x78) {
LAB_00106de4:
    local_20 = pbVar5 + 1;
    fio_atol_skip_zero((char **)&local_20);
    uVar7 = 0;
    while( true ) {
      bVar2 = *local_20;
      bVar3 = bVar2 - 0x30;
      if (0xfffffffffffffeff < uVar7) break;
      if (9 < bVar3) {
        if ((byte)(bVar2 + 0xbf) < 6) {
          bVar3 = bVar2 - 0x37;
        }
        else {
          if (5 < (byte)(bVar2 + 0x9f)) {
            bVar8 = false;
            goto LAB_00106e45;
          }
          bVar3 = bVar2 + 0xa9;
        }
      }
      uVar7 = uVar7 << 4 | (ulong)bVar3;
      local_20 = local_20 + 1;
    }
    bVar8 = (byte)(bVar2 + 0xbf) < 6;
LAB_00106e45:
    if ((byte)(bVar2 + 0x9f) < 6 || (bVar3 < 10 || bVar8)) {
      return 0;
    }
  }
  else {
    if (bVar2 != 0x42) {
      if (bVar2 == 0x58) goto LAB_00106de4;
      if (bVar2 != 0x62) {
        if (bVar2 != 0x30) {
          uVar6 = fio_atol_consume((char **)&local_20,'\n');
          if (0xf5 < (byte)(*local_20 - 0x3a)) {
            return 0;
          }
LAB_00106e7b:
          uVar7 = 0x7fffffffffffffff;
          if (-1 < (long)uVar6) {
            uVar7 = uVar6;
          }
          goto LAB_00106e8c;
        }
        bVar2 = local_20[1];
        pbVar5 = local_20 + 1;
        if (bVar2 != 0x42) {
          if ((bVar2 == 0x58) || (bVar2 == 0x78)) goto LAB_00106de4;
          if (bVar2 != 0x62) {
            fio_atol_skip_zero((char **)&local_20);
            uVar6 = fio_atol_consume((char **)&local_20,'\b');
            if ((*local_20 & 0xf8) == 0x30) {
              return 0;
            }
            goto LAB_00106e7b;
          }
        }
      }
    }
    local_20 = pbVar5 + 1;
    fio_atol_skip_zero((char **)&local_20);
    uVar7 = 0;
    for (; (*local_20 & 0xfe) == 0x30; local_20 = local_20 + 1) {
      uVar7 = ((ulong)*local_20 + uVar7 * 2) - 0x30;
    }
  }
LAB_00106e8c:
  uVar6 = -uVar7;
  if (bVar1 != 0x2d) {
    uVar6 = uVar7;
  }
  *pstr = (char *)local_20;
  return uVar6;
}

Assistant:

int64_t fio_atol(char **pstr) {
  /* No binary representation in strtol */
  char *str = *pstr;
  uint64_t result = 0;
  uint8_t invert = 0;
  while (isspace(*str))
    ++(str);
  if (str[0] == '-') {
    invert ^= 1;
    ++str;
  } else if (*str == '+') {
    ++(str);
  }

  if (str[0] == 'B' || str[0] == 'b' ||
      (str[0] == '0' && (str[1] == 'b' || str[1] == 'B'))) {
    /* base 2 */
    if (str[0] == '0')
      str++;
    str++;
    fio_atol_skip_zero(&str);
    while (str[0] == '0' || str[0] == '1') {
      result = (result << 1) | (str[0] - '0');
      str++;
    }
    goto sign; /* no overlow protection, since sign might be embedded */

  } else if (str[0] == 'x' || str[0] == 'X' ||
             (str[0] == '0' && (str[1] == 'x' || str[1] == 'X'))) {
    /* base 16 */
    if (str[0] == '0')
      str++;
    str++;
    fio_atol_skip_zero(&str);
    result = fio_atol_consume_hex(&str);
    if (fio_atol_skip_hex_test(&str)) /* too large for a number */
      return 0;
    goto sign; /* no overlow protection, since sign might be embedded */
  } else if (str[0] == '0') {
    fio_atol_skip_zero(&str);
    /* base 8 */
    result = fio_atol_consume(&str, 8);
    if (fio_atol_skip_test(&str, 8)) /* too large for a number */
      return 0;
  } else {
    /* base 10 */
    result = fio_atol_consume(&str, 10);
    if (fio_atol_skip_test(&str, 10)) /* too large for a number */
      return 0;
  }
  if (result & ((uint64_t)1 << 63))
    result = INT64_MAX; /* signed overflow protection */
sign:
  if (invert)
    result = 0 - result;
  *pstr = str;
  return (int64_t)result;
}